

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(QTransform *worldTransform)

{
  int iVar1;
  qreal in_RDI;
  long in_FS_OFFSET;
  QLineF v2;
  QLineF v1;
  qreal in_stack_ffffffffffffff60;
  qreal in_stack_ffffffffffffff70;
  double dVar2;
  qreal in_stack_ffffffffffffff78;
  QLineF *in_stack_ffffffffffffff80;
  QLineF local_68;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTransform::type();
  if (iVar1 < 2) {
    dVar2 = 1.0;
  }
  else {
    local_28 = 0xffffffffffffffff;
    local_20 = 0xffffffffffffffff;
    local_18 = 0xffffffffffffffff;
    local_10 = 0xffffffffffffffff;
    QLineF::QLineF(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_RDI,in_stack_ffffffffffffff60);
    local_48 = 0xffffffffffffffff;
    local_40 = 0xffffffffffffffff;
    local_38 = 0xffffffffffffffff;
    local_30 = 0xffffffffffffffff;
    QLineF::QLineF(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                   in_RDI,in_stack_ffffffffffffff60);
    QTransform::map(&local_68);
    QLineF::length();
    QTransform::map((QLineF *)&stack0xffffffffffffff78);
    QLineF::length();
    dVar2 = qSqrt<double>(2.13246588388851e-317);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return dVar2;
  }
  __stack_chk_fail();
}

Assistant:

qreal QStyleOptionGraphicsItem::levelOfDetailFromTransform(const QTransform &worldTransform)
{
    if (worldTransform.type() <= QTransform::TxTranslate)
        return 1; // Translation only? The LOD is 1.

    // Two unit vectors.
    QLineF v1(0, 0, 1, 0);
    QLineF v2(0, 0, 0, 1);
    // LOD is the transformed area of a 1x1 rectangle.
    return qSqrt(worldTransform.map(v1).length() * worldTransform.map(v2).length());
}